

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::CEscape_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view src)

{
  byte bVar1;
  pointer pcVar2;
  lts_20250127 *plVar3;
  lts_20250127 *plVar4;
  ulong uVar5;
  lts_20250127 *plVar6;
  bool bVar7;
  allocator<char> local_69;
  allocator<char> local_68 [32];
  string death_message;
  
  uVar5 = src._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  plVar4 = (lts_20250127 *)0x3fffffffffffffff;
  if (this < (lts_20250127 *)0x3fffffffffffffff) {
    plVar4 = this;
  }
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  plVar6 = (lts_20250127 *)0x0;
  for (plVar3 = (lts_20250127 *)0x0; plVar4 != plVar3; plVar3 = plVar3 + 1) {
    plVar6 = plVar6 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)plVar3[uVar5]];
  }
  for (; this != plVar4; plVar4 = plVar4 + 1) {
    bVar7 = CARRY8((ulong)plVar6,
                   (ulong)(byte)(anonymous_namespace)::kCEscapedLen[(byte)plVar4[uVar5]]);
    plVar6 = plVar6 + (byte)(anonymous_namespace)::kCEscapedLen[(byte)plVar4[uVar5]];
    if (bVar7) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&death_message,
                 "Check escaped_len <= std::numeric_limits<size_t>::max() - char_len failed: ",
                 local_68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"escaped_len overflow",&local_69);
      std::__cxx11::string::append((string *)&death_message);
      std::__cxx11::string::~string((string *)local_68);
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (3,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/escaping.cc"
                 ,0x1be,&death_message);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/escaping.cc"
                    ,0x1be,
                    "size_t absl::lts_20250127::(anonymous namespace)::CEscapedLength(absl::string_view)"
                   );
    }
  }
  if (plVar6 == this) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,uVar5);
  }
  else {
    if (plVar6 + 3 == (lts_20250127 *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&death_message,"Check new_dest_len > cur_dest_len failed: ",local_68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"std::string size overflow",&local_69);
      std::__cxx11::string::append((string *)&death_message);
      std::__cxx11::string::~string((string *)local_68);
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (3,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/escaping.cc"
                 ,0x1d1,&death_message);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/escaping.cc"
                    ,0x1d1,
                    "void absl::lts_20250127::(anonymous namespace)::CEscapeAndAppendInternal(absl::string_view, absl::Nonnull<std::string *>)"
                   );
    }
    strings_internal::
    AppendUninitializedTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::Append(__return_storage_ptr__,(size_t)(plVar6 + 3));
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    for (plVar4 = (lts_20250127 *)0x0; this != plVar4; plVar4 = plVar4 + 1) {
      bVar1 = (anonymous_namespace)::kCEscapedLen[(byte)plVar4[uVar5]];
      *(undefined4 *)pcVar2 =
           *(undefined4 *)
            ("\\000\\001\\002\\003\\004\\005\\006\\007\\010\\t" + (ulong)(byte)plVar4[uVar5] * 4);
      pcVar2 = pcVar2 + bVar1;
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CEscape(absl::string_view src) {
  std::string dest;
  CEscapeAndAppendInternal(src, &dest);
  return dest;
}